

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::AdjustTexturePath(LWOImporter *this,string *out)

{
  string *psVar1;
  char *pcVar2;
  Logger *this_00;
  long lVar3;
  size_type n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *out_local;
  LWOImporter *this_local;
  
  local_18 = out;
  out_local = (string *)this;
  if ((this->mIsLWO2 & 1U) == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = strstr(pcVar2,"(sequence)");
    if (pcVar2 != (char *)0x0) {
      this_00 = DefaultLogger::get();
      Logger::info(this_00,"LWOB: Sequence of animated texture found. It will be ignored");
      psVar1 = local_18;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_58,(ulong)psVar1);
      std::operator+(&local_38,&local_58,"000");
      std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  lVar3 = std::__cxx11::string::find_first_of((char)local_18,0x3a);
  if (lVar3 != -1) {
    std::__cxx11::string::insert((ulong)local_18,(char *)(lVar3 + 1));
  }
  return;
}

Assistant:

void LWOImporter::AdjustTexturePath(std::string& out)
{
    // --- this function is used for both LWO2 and LWOB
    if (!mIsLWO2 && ::strstr(out.c_str(), "(sequence)"))    {

        // remove the (sequence) and append 000
        ASSIMP_LOG_INFO("LWOB: Sequence of animated texture found. It will be ignored");
        out = out.substr(0,out.length()-10) + "000";
    }

    // format: drive:path/file - we just need to insert a slash after the drive
    std::string::size_type n = out.find_first_of(':');
    if (std::string::npos != n) {
        out.insert(n+1,"/");
    }
}